

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProc.h
# Opt level: O1

void __thiscall ImageProc::smoothPerimeter(ImageProc *this,float smoothParam)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  pointer pPVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int j;
  float fVar12;
  float fVar13;
  float fVar14;
  Point2f pnt;
  Point2f local_70;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *local_68;
  float local_60;
  float local_5c;
  Point2f local_58;
  Point2f local_50;
  ImageProc *local_48;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *local_40;
  Point_<float> local_38;
  
  if ((smoothParam < 1.0) && (0.0 < smoothParam)) {
    fVar13 = (float)(ulong)((long)(this->BoundaryPoints).
                                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->BoundaryPoints).
                                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * smoothParam +
             -3.0;
    local_68 = &this->BoundaryPoints;
    if (0.0 < fVar13) {
      iVar11 = (int)(1.0 / smoothParam + 1.0 / smoothParam);
      local_40 = &this->SmoothedBoundaryPoints;
      fVar14 = 0.0;
      iVar9 = 0;
      local_48 = this;
      do {
        fVar12 = (float)(iVar9 + 1);
        if (0 < iVar11) {
          pPVar8 = (local_68->
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          fVar1 = pPVar8[(int)(fVar14 / smoothParam)].x;
          fVar14 = pPVar8[(int)(fVar14 / smoothParam)].y;
          fVar2 = pPVar8[(int)(fVar12 / smoothParam)].x;
          fVar3 = pPVar8[(int)(fVar12 / smoothParam)].y;
          iVar10 = (int)((float)(iVar9 + 2) / smoothParam);
          fVar4 = pPVar8[iVar10].x;
          fVar5 = pPVar8[iVar10].y;
          iVar10 = (int)((float)(iVar9 + 3) / smoothParam);
          fVar6 = pPVar8[iVar10].x;
          fVar7 = pPVar8[iVar10].y;
          iVar10 = 0;
          do {
            local_70.x = fVar2;
            local_70.y = fVar3;
            local_60 = fVar6;
            local_5c = fVar7;
            local_58.x = fVar4;
            local_58.y = fVar5;
            local_50.x = fVar1;
            local_50.y = fVar14;
            pointOnCurve((ImageProc *)&stack0xffffffffffffffc8,(Point2f *)this,&local_50,&local_70,
                         &local_58,(float)iVar10 * smoothParam * 0.5);
            std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                      (local_40,(value_type *)&stack0xffffffffffffffc8);
            iVar10 = iVar10 + 1;
            this = local_48;
          } while (iVar11 != iVar10);
        }
        fVar14 = fVar12;
        iVar9 = iVar9 + 1;
      } while (fVar12 < fVar13);
    }
    local_38 = *(this->SmoothedBoundaryPoints).
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                super__Vector_impl_data._M_start;
    std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::
    emplace_back<cv::Point_<float>>
              ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)
               &this->SmoothedBoundaryPoints,&stack0xffffffffffffffc8);
    pPVar8 = (this->BoundaryPoints).
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->BoundaryPoints).
        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar8) {
      (this->BoundaryPoints).
      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar8;
    }
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator=
              (local_68,&this->SmoothedBoundaryPoints);
  }
  return;
}

Assistant:

void smoothPerimeter(float smoothParam)
	{
		// if given params is out of range return unsmoothed version of perimeter
		if (smoothParam >= 1 || smoothParam <=0)
		{
			return;
		}
			
		std::vector<cv::Point2f> splinePoints;
		double stepsize=1/smoothParam;	
		float length= BoundaryPoints.size() * smoothParam;

		for (int i = 0; i < length - 3; i++)
		{
			cv::Point2f p0= BoundaryPoints[(int)(i/ smoothParam)]; 
			cv::Point2f p1 = BoundaryPoints[(int)((i+1) / smoothParam)];
			cv::Point2f p2 = BoundaryPoints[(int)((i+2) / smoothParam)];
			cv::Point2f p3 = BoundaryPoints[(int)((i+3) / smoothParam)];

			for (int j = 0; j < (int)(2*stepsize); j++)
			{
				//std::cout << j << " " ;
				cv::Point2f pnt= pointOnCurve(p0,  p1,  p2, p3, smoothParam/2*j);
				SmoothedBoundaryPoints.push_back(pnt);
			}
		}
		cv::Point2d first = SmoothedBoundaryPoints[0];
		SmoothedBoundaryPoints.push_back(first);

		BoundaryPoints.clear();		
		BoundaryPoints=SmoothedBoundaryPoints;
		
	}